

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

bool miniply::double_literal(char *start,char **end,double *val)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  cVar1 = *start;
  uVar3 = (ulong)((cVar1 - 0x2bU & 0xfd) == 0);
  bVar2 = start[uVar3];
  if ((byte)(bVar2 - 0x30) < 10) {
    dVar9 = 0.0;
    pbVar4 = (byte *)(start + uVar3 + 1);
    do {
      pbVar5 = pbVar4;
      dVar9 = dVar9 * 10.0 + *(double *)((ulong)bVar2 * 8 + 0x107fc0);
      bVar2 = *pbVar5;
      pbVar4 = pbVar5 + 1;
    } while ((byte)(bVar2 - 0x30) < 10);
    if ((bVar2 == 0x2e) && (bVar2 = *pbVar4, pbVar5 = pbVar4, (byte)(bVar2 - 0x30) < 10)) {
LAB_00104c08:
      dVar8 = 0.1;
      do {
        dVar9 = dVar9 + *(double *)((ulong)bVar2 * 8 + 0x107fc0) * dVar8;
        dVar8 = dVar8 * 0.1;
        bVar2 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
        pbVar5 = pbVar4;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
    if ((bVar2 | 0x20) == 0x65) {
      pbVar4 = pbVar5 + 1;
      bVar7 = (*pbVar4 - 0x2b & 0xfd) == 0;
      pbVar6 = pbVar5 + 1;
      if (bVar7) {
        pbVar6 = pbVar5 + 2;
      }
      bVar2 = pbVar5[(ulong)bVar7 + 1];
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_00104cd9;
      dVar8 = 0.0;
      do {
        dVar8 = dVar8 * 10.0 + *(double *)((ulong)bVar2 * 8 + 0x107fc0);
        bVar2 = pbVar6[1];
        pbVar6 = pbVar6 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
      pbVar5 = pbVar6;
      if (val != (double *)0x0) {
        if (*pbVar4 == 0x2d) {
          dVar8 = -dVar8;
        }
        dVar8 = pow(10.0,dVar8);
        dVar9 = dVar9 * dVar8;
        bVar2 = *pbVar6;
      }
    }
    bVar7 = false;
    if ((bVar2 != 0x2e) && (bVar2 != 0x5f)) {
      bVar7 = false;
      if ((9 < (byte)(bVar2 - 0x30)) && (bVar7 = false, 0x19 < (byte)((bVar2 | 0x20) + 0x9f))) {
        if (val != (double *)0x0) {
          if (cVar1 == '-') {
            dVar9 = -dVar9;
          }
          *val = dVar9;
        }
        bVar7 = true;
        if (end != (char **)0x0) {
          *end = (char *)pbVar5;
        }
      }
    }
  }
  else {
    if (bVar2 == 0x2e) {
      bVar2 = start[uVar3 + 1];
      if ((byte)(bVar2 - 0x30) < 10) {
        pbVar4 = (byte *)(start + uVar3 + 1);
        dVar9 = 0.0;
        goto LAB_00104c08;
      }
    }
LAB_00104cd9:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool double_literal(const char* start, char const** end, double* val)
  {
    const char* pos = start;

    bool negative = false;
    if (*pos == '-') {
      negative = true;
      ++pos;
    }
    else if (*pos == '+') {
      ++pos;
    }

    double localVal = 0.0;

    bool hasIntDigits = is_digit(*pos);
    if (hasIntDigits) {
      do {
        localVal = localVal * 10.0 + kDoubleDigits[*pos - '0'];
        ++pos;
      } while (is_digit(*pos));
    }
    else if (*pos != '.') {
//      set_error("Not a floating point number");
      return false;
    }

    bool hasFracDigits = false;
    if (*pos == '.') {
      ++pos;
      hasFracDigits = is_digit(*pos);
      if (hasFracDigits) {
        double scale = 0.1;
        do {
          localVal += scale * kDoubleDigits[*pos - '0'];
          scale *= 0.1;
          ++pos;
        } while (is_digit(*pos));
      }
      else if (!hasIntDigits) {
//        set_error("Floating point number has no digits before or after the decimal point");
        return false;
      }
    }

    bool hasExponent = *pos == 'e' || *pos == 'E';
    if (hasExponent) {
      ++pos;
      bool negativeExponent = false;
      if (*pos == '-') {
        negativeExponent = true;
        ++pos;
      }
      else if (*pos == '+') {
        ++pos;
      }

      if (!is_digit(*pos)) {
//        set_error("Floating point exponent has no digits");
        return false; // error: exponent part has no digits.
      }

      double exponent = 0.0;
      do {
        exponent = exponent * 10.0 + kDoubleDigits[*pos - '0'];
        ++pos;
      } while (is_digit(*pos));

      if (val != nullptr) {
        if (negativeExponent) {
          exponent = -exponent;
        }
        localVal *= std::pow(10.0, exponent);
      }
    }

    if (*pos == '.' || *pos == '_' || is_alnum(*pos)) {
//      set_error("Floating point number has trailing chars");
      return false;
    }

    if (negative) {
      localVal = -localVal;
    }

    if (val != nullptr) {
      *val = localVal;
    }
    if (end != nullptr) {
      *end = pos;
    }
    return true;
  }